

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O3

lysc_must ** lysc_node_musts_p(lysc_node *node)

{
  ushort uVar1;
  
  if (node == (lysc_node *)0x0) {
    return (lysc_must **)0x0;
  }
  uVar1 = node->nodetype;
  if (uVar1 < 0x20) {
    if (uVar1 < 8) {
      if (uVar1 != 1) {
        if (uVar1 != 4) {
          return (lysc_must **)0x0;
        }
LAB_00162089:
        return (lysc_must **)(node + 1);
      }
    }
    else {
      if (uVar1 == 8) goto LAB_00162089;
      if (uVar1 != 0x10) {
        return (lysc_must **)0x0;
      }
    }
  }
  else {
    if (uVar1 < 0x400) {
      if ((uVar1 != 0x20) && (uVar1 != 0x60)) {
        return (lysc_must **)0x0;
      }
      goto LAB_00162089;
    }
    if (((uVar1 != 0x400) && (uVar1 != 0x1000)) && (uVar1 != 0x2000)) {
      return (lysc_must **)0x0;
    }
  }
  return (lysc_must **)&node[1].module;
}

Assistant:

struct lysc_must **
lysc_node_musts_p(const struct lysc_node *node)
{
    if (!node) {
        return NULL;
    }

    switch (node->nodetype) {
    case LYS_CONTAINER:
        return &((struct lysc_node_container *)node)->musts;
    case LYS_LEAF:
        return &((struct lysc_node_leaf *)node)->musts;
    case LYS_LEAFLIST:
        return &((struct lysc_node_leaflist *)node)->musts;
    case LYS_LIST:
        return &((struct lysc_node_list *)node)->musts;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        return &((struct lysc_node_anydata *)node)->musts;
    case LYS_NOTIF:
        return &((struct lysc_node_notif *)node)->musts;
    case LYS_INPUT:
    case LYS_OUTPUT:
        return &((struct lysc_node_action_inout *)node)->musts;
    default:
        return NULL;
    }
}